

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImFontConfig_resizeT(ImVector_ImFontConfig *self,int new_size,ImFontConfig v)

{
  int new_size_local;
  ImVector_ImFontConfig *self_local;
  
  ImVector<ImFontConfig>::resize(self,new_size,&v);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontConfig_resizeT(ImVector_ImFontConfig* self,int new_size,const ImFontConfig v)
{
    return self->resize(new_size,v);
}